

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.h
# Opt level: O3

void __thiscall soplex::SPxWeightST<double>::SPxWeightST(SPxWeightST<double> *this)

{
  (this->super_SPxStarter<double>).m_name = "Weight";
  (this->super_SPxStarter<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_SPxStarter<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_SPxStarter<double>)._vptr_SPxStarter = (_func_int **)&PTR__SPxWeightST_003b0f20;
  (this->forbidden).data = (int *)0x0;
  (this->forbidden).memFactor = 1.2;
  (this->forbidden).thesize = 0;
  (this->forbidden).themax = 1;
  spx_alloc<int*>(&(this->forbidden).data,1);
  Array<double>::Array(&this->rowWeight,0);
  Array<double>::Array(&this->colWeight,0);
  (this->rowRight).data = (bool *)0x0;
  (this->rowRight).memFactor = 1.2;
  (this->rowRight).thesize = 0;
  (this->rowRight).themax = 1;
  spx_alloc<bool*>(&(this->rowRight).data,1);
  (this->colUp).data = (bool *)0x0;
  (this->colUp).memFactor = 1.2;
  (this->colUp).thesize = 0;
  (this->colUp).themax = 1;
  spx_alloc<bool*>(&(this->colUp).data,1);
  this->weight = (Array<double> *)0x0;
  this->coWeight = (Array<double> *)0x0;
  return;
}

Assistant:

SPxWeightST()
      : SPxStarter<R>("Weight")
   {
      weight = nullptr;
      coWeight = nullptr;
      assert(isConsistent());
   }